

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadSketch.h
# Opt level: O0

void __thiscall
SpreadSketchWrapper<4U>::Check
          (SpreadSketchWrapper<4U> *this,HashMap<4U> *mp,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  const_reference ppbVar6;
  ostream *poVar7;
  int iVar8;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_RDX;
  long in_RDI;
  int size;
  int hit;
  int all;
  int value;
  Data<4U> key;
  pair<unsigned_int,_unsigned_int> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range2;
  HashMap<4U> our_result;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  result;
  iterator it;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_fffffffffffffec8;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_fffffffffffffed0;
  double dVar9;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this_00;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_c8;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  uint local_a4;
  reference local_a0;
  pair<unsigned_int,_unsigned_int> *local_98;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  val_tp thresh;
  DetectorSS *in_stack_ffffffffffffff80;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_20;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_18;
  
  thresh = (val_tp)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_18 = in_RDX;
  std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::_Node_iterator
            ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x115b1e);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)0x115b30);
  DetectorSS::Query(in_stack_ffffffffffffff80,thresh,
                    (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)in_stack_ffffffffffffff70._M_current);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x115b55);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::begin((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *)in_stack_fffffffffffffec8);
  local_98 = (pair<unsigned_int,_unsigned_int> *)
             std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::end((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)in_stack_fffffffffffffec8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffed0,
                            (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffec8), bVar2) {
    local_a0 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator*((__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                            *)&stack0xffffffffffffff70);
    Data<4U>::Data((Data<4U> *)0x115bcf);
    local_a4 = local_a0->first;
    uVar1 = local_a0->second;
    puVar3 = (uint *)std::
                     unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                     ::operator[](in_stack_fffffffffffffed0,(key_type *)in_stack_fffffffffffffec8);
    *puVar3 = uVar1;
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++((__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  *)&stack0xffffffffffffff70);
  }
  local_a8 = 0;
  local_ac = 0;
  local_b0 = 0;
  local_b4 = 0;
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::begin(in_stack_fffffffffffffec8);
  local_20._M_cur = local_c0._M_cur;
  while( true ) {
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_fffffffffffffec8);
    bVar2 = std::__detail::operator!=(&local_20,&local_c8);
    if (!bVar2) break;
    std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
              ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x115ce8);
    pmVar4 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[](in_stack_fffffffffffffed0,(key_type *)in_stack_fffffffffffffec8);
    local_a8 = *pmVar4;
    ppVar5 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x115d1a);
    if ((*(int *)(in_RDI + 0x68) < ppVar5->second) &&
       (local_ac = local_ac + 1, *(int *)(in_RDI + 0x68) < local_a8)) {
      local_b0 = local_b0 + 1;
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x115d6f);
      iVar8 = ppVar5->second - local_a8;
      if (iVar8 < 1) {
        iVar8 = -iVar8;
      }
      *(double *)(in_RDI + 0x38) = (double)iVar8 + *(double *)(in_RDI + 0x38);
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x115da3);
      iVar8 = ppVar5->second - local_a8;
      if (iVar8 < 1) {
        iVar8 = -iVar8;
      }
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x115dcb);
      *(double *)(in_RDI + 0x40) =
           (double)iVar8 / (double)ppVar5->second + *(double *)(in_RDI + 0x40);
    }
    if (*(int *)(in_RDI + 0x68) < local_a8) {
      local_b4 = local_b4 + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
               in_stack_fffffffffffffed0);
  }
  *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) / (double)local_b0;
  *(double *)(in_RDI + 0x40) = *(double *)(in_RDI + 0x40) / (double)local_b0;
  *(double *)(in_RDI + 0x30) = (double)local_b0 / (double)local_ac;
  *(double *)(in_RDI + 0x28) = (double)local_b0 / (double)local_b4;
  ppbVar6 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,0);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar6,*(double *)(in_RDI + 0x40));
  std::operator<<(poVar7,",");
  ppbVar6 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar6,*(double *)(in_RDI + 0x30));
  std::operator<<(poVar7,",");
  ppbVar6 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar6,*(double *)(in_RDI + 0x28));
  std::operator<<(poVar7,",");
  ppbVar6 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,3);
  this_00 = (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)(*(double *)(in_RDI + 0x28) * 2.0 * *(double *)(in_RDI + 0x30));
  if (1e-06 <= *(double *)(in_RDI + 0x30) + *(double *)(in_RDI + 0x28)) {
    dVar9 = *(double *)(in_RDI + 0x30) + *(double *)(in_RDI + 0x28);
  }
  else {
    dVar9 = 1.0;
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar6,(double)this_00 / dVar9);
  std::operator<<(poVar7,",");
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x116005);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		vector<pair<key_tp, val_tp>> result;
		sketch->Query(this->HIT, result);
		HashMap<DATA_LEN> our_result;
		for (auto const& p : result) {
			Data<DATA_LEN> key;
			memcpy(key.str, &(p.first), sizeof(Data<DATA_LEN>));
			our_result[key] = p.second;
		}

		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = our_result[it->first];
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}

		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->are << ",";
		*outs[1] << this->cr << ",";
		*outs[2] << this->pr << ",";
		*outs[3] << 2 * this->pr * this->cr / ((this->cr + this->pr < 1e-6) ? 1 : this->cr + this->pr) << ",";
	}